

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O1

tensor * Abs(tensor *a)

{
  undefined8 *puVar1;
  tensor *ptVar2;
  initializer_list<tensor_*> __l;
  allocator_type local_31;
  vector<tensor_*,_std::allocator<tensor_*>_> local_30;
  tensor *local_18;
  
  puVar1 = (undefined8 *)operator_new(0x48);
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  puVar1[4] = 0;
  puVar1[5] = 0;
  puVar1[6] = 0;
  puVar1[7] = 0;
  puVar1[8] = 0;
  *puVar1 = &PTR_forward_0010a988;
  *(undefined1 *)(puVar1 + 8) = 0;
  node::node_cnt = node::node_cnt + 1;
  *puVar1 = &PTR_forward_0010ac90;
  __l._M_len = 1;
  __l._M_array = &local_18;
  local_18 = a;
  std::vector<tensor_*,_std::allocator<tensor_*>_>::vector(&local_30,__l,&local_31);
  ptVar2 = (tensor *)(**(code **)*puVar1)(puVar1,&local_30);
  if (local_30.super__Vector_base<tensor_*,_std::allocator<tensor_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<tensor_*,_std::allocator<tensor_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_30.super__Vector_base<tensor_*,_std::allocator<tensor_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.super__Vector_base<tensor_*,_std::allocator<tensor_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return ptVar2;
}

Assistant:

tensor* Abs(tensor *a){
    node *op = new ABS();
    return op->forward({a});
}